

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_fs_poll_ref(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 uVar3;
  uv_fs_poll_t h;
  undefined1 auStack_388 [248];
  code *pcStack_290;
  undefined1 auStack_280 [248];
  code *pcStack_188;
  undefined1 auStack_178 [248];
  code *pcStack_80;
  undefined1 local_70 [104];
  
  pcStack_80 = (code *)0x169569;
  uVar2 = uv_default_loop();
  pcStack_80 = (code *)0x169579;
  uv_fs_poll_init(uVar2,local_70);
  pcStack_80 = (code *)0x16958f;
  uv_fs_poll_start(local_70,0,".",999);
  pcStack_80 = (code *)0x169597;
  uv_unref(local_70);
  pcStack_80 = (code *)0x16959c;
  uVar2 = uv_default_loop();
  pcStack_80 = (code *)0x1695a6;
  uv_run(uVar2,0);
  pcStack_80 = (code *)0x1695ae;
  do_close(local_70);
  pcStack_80 = (code *)0x1695b3;
  uVar2 = uv_default_loop();
  pcStack_80 = (code *)0x1695c7;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_80 = (code *)0x1695d1;
  uv_run(uVar2,0);
  pcStack_80 = (code *)0x1695d6;
  uVar3 = uv_default_loop();
  pcStack_80 = (code *)0x1695de;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_80 = run_test_tcp_ref;
  run_test_fs_poll_ref_cold_1();
  pcStack_188 = (code *)0x1695fc;
  pcStack_80 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_188 = (code *)0x16960c;
  uv_tcp_init(uVar2,auStack_178);
  pcStack_188 = (code *)0x169614;
  uv_unref(auStack_178);
  pcStack_188 = (code *)0x169619;
  uVar2 = uv_default_loop();
  pcStack_188 = (code *)0x169623;
  uv_run(uVar2,0);
  pcStack_188 = (code *)0x16962b;
  do_close(auStack_178);
  pcStack_188 = (code *)0x169630;
  uVar2 = uv_default_loop();
  pcStack_188 = (code *)0x169644;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_188 = (code *)0x16964e;
  uv_run(uVar2,0);
  pcStack_188 = (code *)0x169653;
  uVar3 = uv_default_loop();
  pcStack_188 = (code *)0x16965b;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_188 = run_test_tcp_ref2;
  run_test_tcp_ref_cold_1();
  pcStack_290 = (code *)0x16967c;
  pcStack_188 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_290 = (code *)0x16968c;
  uv_tcp_init(uVar2,auStack_280);
  pcStack_290 = (code *)0x1696a0;
  uv_listen(auStack_280,0x80,fail_cb);
  pcStack_290 = (code *)0x1696a8;
  uv_unref(auStack_280);
  pcStack_290 = (code *)0x1696ad;
  uVar2 = uv_default_loop();
  pcStack_290 = (code *)0x1696b7;
  uv_run(uVar2,0);
  pcStack_290 = (code *)0x1696bf;
  do_close(auStack_280);
  pcStack_290 = (code *)0x1696c4;
  uVar2 = uv_default_loop();
  pcStack_290 = (code *)0x1696d8;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_290 = (code *)0x1696e2;
  uv_run(uVar2,0);
  pcStack_290 = (code *)0x1696e7;
  uVar3 = uv_default_loop();
  pcStack_290 = (code *)0x1696ef;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_290 = run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  pcStack_290 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_tcp_init(uVar2,auStack_388);
  uv_listen(auStack_388,0x80,fail_cb);
  uv_unref(auStack_388);
  uv_close(auStack_388,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called == 1) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_ref) {
  uv_fs_poll_t h;
  uv_fs_poll_init(uv_default_loop(), &h);
  uv_fs_poll_start(&h, NULL, ".", 999);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}